

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O1

bool duckdb::TryCastFromDecimal::Operation<short,short>
               (int16_t input,int16_t *result,CastParameters *parameters,uint8_t width,uint8_t scale
               )

{
  undefined2 in_register_0000003a;
  undefined7 in_register_00000081;
  
  *result = (int16_t)(((long)CONCAT22(in_register_0000003a,input) +
                      (long)((-(ulong)((ushort)input >> 0xf) ^
                             *(ulong *)(NumericHelper::POWERS_OF_TEN +
                                       (CONCAT71(in_register_00000081,scale) & 0xffffffff) * 8)) +
                            (ulong)((ushort)input >> 0xf)) / 2) /
                     (long)*(ulong *)(NumericHelper::POWERS_OF_TEN +
                                     (CONCAT71(in_register_00000081,scale) & 0xffffffff) * 8));
  return true;
}

Assistant:

bool TryCastFromDecimal::Operation(int16_t input, int16_t &result, CastParameters &parameters, uint8_t width,
                                   uint8_t scale) {
	return TryCastDecimalToNumeric<int16_t, int16_t>(input, result, parameters, scale);
}